

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  Size __first;
  char cVar12;
  int y;
  int iVar13;
  int iVar14;
  int iVar15;
  size_type __new_size;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  void *pvVar19;
  byte *pbVar20;
  pointer pOVar21;
  vector<Object,_std::allocator<Object>_> *objects_00;
  ulong uVar22;
  pointer pOVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int j_2;
  ulong uVar27;
  int iVar28;
  size_t i;
  pointer pOVar29;
  int j;
  int iVar30;
  int j_1;
  long lVar31;
  float fVar32;
  float fVar33;
  pointer pfVar34;
  __m128 t_2;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar35 [16];
  pointer pfVar36;
  __m128 t;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float local_5b8;
  float fStack_5b4;
  vector<Object,_std::allocator<Object>_> objects;
  float local_578;
  float fStack_574;
  Extractor ex;
  undefined1 local_520 [8];
  Mat local_518;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Size label_size;
  vector<int,_std::allocator<int>_> picked;
  long *local_410;
  Mat local_3f8;
  Mat local_3a8;
  Mat local_358;
  undefined8 local_310;
  _InputArray local_308;
  undefined8 uStack_2f0;
  int baseLine;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  int iStack_290;
  Allocator *local_288;
  int iStack_280;
  int iStack_27c;
  int iStack_278;
  undefined8 uStack_274;
  size_t local_268;
  undefined4 local_260 [2];
  Mat *local_258;
  undefined8 local_250;
  vector<float,_std::allocator<float>_> areas;
  vector<float,_std::allocator<float>_> local_230 [9];
  uint local_148;
  uint uStack_144;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  Net yolact;
  Mat m;
  uint local_a8;
  uint uStack_a4;
  uchar *local_a0;
  float norm_vals [3];
  float mean_vals [3];
  
  if (argc == 2) {
    pcVar8 = argv[1];
    std::__cxx11::string::string((string *)&areas,pcVar8,(allocator *)&picked);
    cv::imread((string *)&m,(int)&areas);
    std::__cxx11::string::~string((string *)&areas);
    cVar12 = cv::Mat::empty();
    if (cVar12 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolact);
      yolact.opt.use_vulkan_compute = true;
      iVar13 = ncnn::Net::load_param(&yolact,"yolact.param");
      if ((iVar13 != 0) || (iVar13 = ncnn::Net::load_model(&yolact,"yolact.bin"), iVar13 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_518,local_a0,0x10002,uStack_a4,local_a8,0x226,0x226,(Allocator *)0x0);
      mean_vals[0] = 123.68;
      mean_vals[1] = 116.78;
      mean_vals[2] = 103.94;
      norm_vals[0] = 0.017123288;
      norm_vals[1] = 0.017507004;
      norm_vals[2] = 0.017427675;
      ncnn::Mat::substract_mean_normalize(&local_518,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"input.1",&local_518);
      local_358.cstep = 0;
      local_358.data = (void *)0x0;
      local_358.refcount._0_4_ = 0;
      local_358.refcount._4_4_ = 0;
      local_358.elemsize._0_4_ = 0;
      local_358.elemsize._4_4_ = 0;
      local_358.elempack = 0;
      local_3a8.cstep = 0;
      local_358.allocator = (Allocator *)0x0;
      local_358.dims = 0;
      local_358.w = 0;
      local_358.h = 0;
      local_358.d = 0;
      local_358.c = 0;
      local_3a8.data = (void *)0x0;
      local_3a8.refcount._0_4_ = 0;
      local_3a8.refcount._4_4_ = 0;
      local_3a8.elemsize._0_4_ = 0;
      local_3a8.elemsize._4_4_ = 0;
      local_3a8.elempack = 0;
      local_3a8.allocator = (Allocator *)0x0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      label_size.width = 0;
      label_size.height = 0;
      local_3f8.cstep = 0;
      local_3f8.data = (void *)0x0;
      local_3f8.refcount._0_4_ = 0;
      local_3f8.refcount._4_4_ = 0;
      local_3f8.elemsize._0_4_ = 0;
      local_3f8.elemsize._4_4_ = 0;
      local_3f8.elempack = 0;
      local_3f8.allocator = (Allocator *)0x0;
      local_3f8.dims = 0;
      local_3f8.w = 0;
      local_3f8.h = 0;
      local_3f8.d = 0;
      local_3f8.c = 0;
      ncnn::Extractor::extract(&ex,"619",&local_358,0);
      ncnn::Extractor::extract(&ex,"816",&local_3a8,0);
      ncnn::Extractor::extract(&ex,"818",(Mat *)&label_size,0);
      ncnn::Extractor::extract(&ex,"820",&local_3f8,0);
      iVar13 = local_3f8.h;
      __new_size = (size_type)local_3f8.w;
      uVar17 = (ulong)(uint)local_3f8.h;
      local_268 = 0;
      _baseLine = (float *)0x0;
      uStack_2a0 = 0;
      uStack_29c = 0;
      local_298 = 0;
      uStack_294 = 0;
      iStack_290 = 0;
      local_288 = (Allocator *)0x0;
      iStack_280 = 0;
      iStack_27c = 0;
      iStack_278 = 0;
      uStack_274._0_4_ = 0;
      uStack_274._4_4_ = 0;
      ncnn::Mat::create((Mat *)&baseLine,4,local_3f8.h,4,(Allocator *)0x0);
      pfVar18 = _baseLine;
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        iVar14 = (&DAT_00538420)[lVar16];
        fVar33 = (float)(&DAT_00538440)[lVar16];
        iVar28 = 0;
        iVar15 = iVar14;
        if (iVar14 < 1) {
          iVar15 = iVar28;
        }
        for (; iVar28 != iVar15; iVar28 = iVar28 + 1) {
          for (iVar30 = 0; iVar30 != iVar15; iVar30 = iVar30 + 1) {
            for (lVar31 = 0; lVar31 != 0xc; lVar31 = lVar31 + 4) {
              fVar32 = *(float *)((long)&DAT_00538434 + lVar31);
              if (fVar32 < 0.0) {
                fVar32 = sqrtf(fVar32);
              }
              else {
                fVar32 = SQRT(fVar32);
              }
              fVar32 = (fVar32 * fVar33) / 550.0;
              *pfVar18 = ((float)iVar30 + 0.5) / (float)iVar14;
              pfVar18[1] = ((float)iVar28 + 0.5) / (float)iVar14;
              pfVar18[2] = fVar32;
              pfVar18[3] = fVar32;
              pfVar18 = pfVar18 + 4;
            }
          }
        }
      }
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::resize(&class_candidates,__new_size);
      uVar25 = 0;
      if (iVar13 < 1) {
        uVar17 = uVar25;
      }
      for (; pfVar18 = _baseLine, pvVar19 = local_3a8.data, __first = label_size, uVar22 = 1,
          uVar25 != uVar17; uVar25 = uVar25 + 1) {
        uVar26 = 0;
        fVar33 = 0.0;
        for (; (long)uVar22 < (long)__new_size; uVar22 = uVar22 + 1) {
          fVar32 = *(float *)((long)local_3f8.data +
                             uVar22 * 4 +
                             CONCAT44(local_3f8.elemsize._4_4_,(undefined4)local_3f8.elemsize) *
                             uVar25 * (long)local_3f8.w);
          if (fVar33 < fVar32) {
            uVar26 = uVar22 & 0xffffffff;
            fVar33 = fVar32;
          }
        }
        iVar13 = (int)uVar26;
        if ((iVar13 != 0) && (0.05 < fVar33)) {
          lVar31 = (long)iStack_27c * uVar25 * CONCAT44(uStack_294,local_298);
          lVar16 = (long)local_3a8.w * uVar25 *
                   CONCAT44(local_3a8.elemsize._4_4_,(undefined4)local_3a8.elemsize);
          local_310 = 0;
          local_118 = expf(*(float *)((long)local_3a8.data + lVar16 + 8) * 0.2);
          fStack_114 = extraout_XMM0_Db;
          local_138 = expf(*(float *)((long)pvVar19 + lVar16 + 0xc) * 0.2);
          local_128 = *(undefined8 *)((long)pfVar18 + lVar31);
          uStack_120 = 0;
          uVar3 = *(undefined8 *)((long)pfVar18 + lVar31 + 8);
          uVar4 = *(undefined8 *)((long)pvVar19 + lVar16);
          local_148 = local_a8;
          uStack_144 = uStack_a4;
          uStack_140 = 0;
          fStack_134 = extraout_XMM0_Db_00;
          Object::Object((Object *)&areas);
          local_578 = (float)uVar3;
          fStack_574 = (float)((ulong)uVar3 >> 0x20);
          local_5b8 = (float)uVar4;
          fStack_5b4 = (float)((ulong)uVar4 >> 0x20);
          fVar47 = local_5b8 * 0.1 * local_578 + (float)local_128;
          fVar48 = fStack_5b4 * 0.1 * fStack_574 + local_128._4_4_;
          fVar32 = local_118 * local_578 * 0.5;
          fVar44 = local_138 * fStack_574 * 0.5;
          fVar45 = fStack_114 * 0.0 * 0.0;
          fVar46 = fStack_134 * 0.0 * 0.0;
          auVar38._0_4_ = (fVar32 + fVar47) * (float)(int)uStack_144;
          auVar38._4_4_ = (fVar44 + fVar48) * (float)(int)local_148;
          auVar38._8_4_ = (fVar45 + (float)uStack_120 + 0.0) * (float)(int)uStack_140;
          auVar38._12_4_ = (fVar46 + uStack_120._4_4_ + 0.0) * (float)(int)uStack_144;
          auVar43._0_8_ = CONCAT44((float)(int)(local_148 - 1),(float)(int)(uStack_144 - 1));
          auVar43._8_4_ = (float)((int)uStack_140 + -1);
          auVar43._12_4_ = (float)(int)(uStack_144 - 1);
          auVar40._8_4_ = auVar43._8_4_;
          auVar40._0_8_ = auVar43._0_8_;
          auVar40._12_4_ = auVar43._12_4_;
          auVar41 = minps(auVar40,auVar38);
          auVar38 = maxps(ZEXT816(0),auVar41);
          auVar41._4_4_ = (fVar48 - fVar44) * (float)(int)local_148;
          auVar41._0_4_ = (fVar47 - fVar32) * (float)(int)uStack_144;
          auVar41._8_4_ = (((float)uStack_120 + 0.0) - fVar45) * (float)(int)uStack_140;
          auVar41._12_4_ = ((uStack_120._4_4_ + 0.0) - fVar46) * (float)(int)uStack_144;
          auVar41 = minps(auVar43,auVar41);
          auVar41 = maxps(ZEXT816(0),auVar41);
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = (auVar38._4_4_ - auVar41._4_4_) + 1.0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = (auVar38._0_4_ - auVar41._0_4_) + 1.0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = auVar41._0_8_;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)CONCAT44(fVar33,iVar13);
          std::vector<float,std::allocator<float>>::vector<float_const*,void>
                    ((vector<float,std::allocator<float>> *)&picked,(float *)__first,
                     (float *)__first,(allocator_type *)&local_308);
          std::vector<float,_std::allocator<float>_>::_M_move_assign
                    (local_230,(vector<float,std::allocator<float>> *)&picked);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&picked);
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar13,(Object *)&areas);
          Object::~Object((Object *)&areas);
        }
      }
      std::vector<Object,_std::allocator<Object>_>::clear(&objects);
      lVar16 = 0;
      while( true ) {
        if ((int)(((long)class_candidates.
                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)class_candidates.
                        super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= lVar16) break;
        objects_00 = class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar16;
        qsort_descent_inplace(objects_00);
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar17 = ((long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0x90;
        iVar13 = (int)uVar17;
        std::vector<float,_std::allocator<float>_>::vector
                  (&areas,(long)iVar13,(allocator_type *)&local_308);
        uVar25 = 0;
        if (0 < iVar13) {
          uVar25 = uVar17 & 0xffffffff;
        }
        pfVar18 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        for (uVar17 = 0; uVar25 != uVar17; uVar17 = uVar17 + 1) {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar17] = pfVar18[-1] * *pfVar18;
          pfVar18 = pfVar18 + 0x24;
        }
        iVar14 = 0;
        while( true ) {
          local_308.flags = iVar14;
          if (iVar13 <= iVar14) break;
          pOVar29 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar23 = pOVar29 + iVar14;
          uVar25 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2;
          uVar17 = uVar25 & 0xffffffff;
          if ((int)uVar25 < 1) {
            uVar17 = 0;
          }
          uVar25 = 1;
          for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
            iVar15 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            if (pOVar23->label == pOVar29[iVar15].label) {
              pOVar21 = pOVar29 + iVar15;
              uVar26._0_4_ = (pOVar23->rect).x;
              uVar26._4_4_ = (pOVar23->rect).y;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar26;
              uVar1 = (pOVar23->rect).width;
              uVar5 = (pOVar23->rect).height;
              uVar27._0_4_ = (pOVar21->rect).x;
              uVar27._4_4_ = (pOVar21->rect).y;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar27;
              uVar2 = (pOVar21->rect).width;
              uVar6 = (pOVar21->rect).height;
              auVar35._0_4_ = (float)uVar2 + (float)(undefined4)uVar27;
              auVar35._4_4_ = (float)uVar6 + (float)uVar27._4_4_;
              auVar35._8_8_ = 0;
              auVar43 = maxps(auVar42,auVar37);
              auVar39._0_4_ = (float)uVar1 + (float)(undefined4)uVar26;
              auVar39._4_4_ = (float)uVar5 + (float)uVar26._4_4_;
              auVar39._8_8_ = 0;
              auVar41 = minps(auVar35,auVar39);
              fVar33 = auVar41._0_4_ - auVar43._0_4_;
              fVar44 = auVar41._4_4_ - auVar43._4_4_;
              fVar32 = 0.0;
              if (0.0 < fVar44 && 0.0 < fVar33) {
                fVar32 = fVar33 * fVar44;
              }
              if (0.5 < fVar32 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar14] +
                                  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar15]) - fVar32)) {
                uVar25 = 0;
              }
            }
          }
          if ((int)uVar25 != 0) {
            std::vector<int,_std::allocator<int>_>::push_back(&picked,&local_308.flags);
            iVar14 = local_308.flags;
          }
          iVar14 = iVar14 + 1;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&areas.super__Vector_base<float,_std::allocator<float>_>);
        for (lVar31 = 0;
            lVar31 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start) >> 2);
            lVar31 = lVar31 + 1) {
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                              _M_impl.super__Vector_impl_data._M_start +
                              picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar31]);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&picked.super__Vector_base<int,_std::allocator<int>_>);
        lVar16 = lVar16 + 1;
      }
      qsort_descent_inplace(&objects);
      if (200 < (int)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x90)) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,200);
      }
      uVar17 = 0;
      if (0 < (int)uStack_a4) {
        uVar17 = (ulong)uStack_a4;
      }
      uVar25 = 0;
      if (0 < (int)local_a8) {
        uVar25 = (ulong)local_a8;
      }
      for (lVar16 = 0;
          pOVar29 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start,
          lVar16 < (int)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x90); lVar16 = lVar16 + 1) {
        cv::Mat::Mat((Mat *)&areas,local_358.h,local_358.w,5);
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&picked,0.0);
        cv::Mat::operator=((Mat *)&areas,(Scalar_ *)&picked);
        pOVar29 = pOVar29 + lVar16;
        uVar22 = (ulong)(uint)(local_358.h * local_358.w);
        if (local_358.h * local_358.w < 1) {
          uVar22 = 0;
        }
        uVar10 = local_358.c;
        if (local_358.c < 1) {
          uVar10 = 0;
        }
        pvVar19 = local_358.data;
        for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
          fVar33 = (pOVar29->maskdata).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar26];
          for (uVar27 = 0; uVar22 != uVar27; uVar27 = uVar27 + 1) {
            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage[uVar27] =
                 *(float *)((long)pvVar19 + uVar27 * 4) * fVar33 +
                 areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar27];
          }
          pvVar19 = (void *)((long)pvVar19 +
                            CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize) *
                            local_358.cstep);
        }
        cv::Mat::Mat((Mat *)&picked);
        local_308.sz.width = 0;
        local_308.sz.height = 0;
        local_308.flags = 0x1010000;
        local_308.obj = &areas;
        local_250 = 0;
        local_260[0] = 0x2010000;
        local_258 = (Mat *)&picked;
        cv::resize(&local_308,local_260,local_520);
        cv::Mat::Mat((Mat *)&local_308,local_a8,uStack_a4,0);
        cv::Mat::operator=(&pOVar29->mask,(Mat *)&local_308);
        cv::Mat::~Mat((Mat *)&local_308);
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&local_308,0.0);
        cv::Mat::operator=(&pOVar29->mask,(Scalar_ *)&local_308);
        for (uVar22 = 0; uVar22 != uVar25; uVar22 = uVar22 + 1) {
          fVar33 = (pOVar29->rect).y;
          if ((fVar33 <= (float)(int)uVar22) &&
             ((float)(int)uVar22 <= fVar33 + (pOVar29->rect).height)) {
            lVar31 = **(long **)&pOVar29->field_0x78;
            lVar9 = *(long *)&pOVar29->field_0x40;
            lVar24 = *local_410;
            for (uVar26 = 0; uVar17 != uVar26; uVar26 = uVar26 + 1) {
              fVar33 = (pOVar29->rect).x;
              if ((fVar33 <= (float)(int)uVar26) &&
                 ((float)(int)uVar26 <= fVar33 + (pOVar29->rect).width)) {
                *(char *)(lVar31 * uVar22 + lVar9 + uVar26) =
                     -(0.5 < *(float *)((long)picked.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                       uVar26 * 4 + lVar24 * uVar22));
              }
            }
          }
        }
        cv::Mat::~Mat((Mat *)&picked);
        cv::Mat::~Mat((Mat *)&areas);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      piVar11 = (int *)CONCAT44(uStack_29c,uStack_2a0);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_288 == (Allocator *)0x0) {
            free(_baseLine);
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(local_3f8.refcount._4_4_,local_3f8.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_3f8.allocator == (Allocator *)0x0) {
            free(local_3f8.data);
          }
          else {
            (*(local_3f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(local_3a8.refcount._4_4_,(int)local_3a8.refcount);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            free(local_3a8.data);
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(local_358.refcount._4_4_,(int)local_358.refcount);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_358.allocator == (Allocator *)0x0) {
            free(local_358.data);
          }
          else {
            (*(local_358.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if ((vector<int,_std::allocator<int>_> *)local_518.refcount !=
          (vector<int,_std::allocator<int>_> *)0x0) {
        LOCK();
        *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_518.refcount)->_M_impl).
                 super__Vector_impl_data._M_start =
             *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_518.refcount)->_M_impl).
                      super__Vector_impl_data._M_start + -1;
        UNLOCK();
        if (*(int *)&(((_Vector_base<int,_std::allocator<int>_> *)local_518.refcount)->_M_impl).
                     super__Vector_impl_data._M_start == 0) {
          if (local_518.allocator == (Allocator *)0x0) {
            free(local_518.data);
          }
          else {
            (*(local_518.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolact);
      cv::Mat::clone();
      iVar13 = 0;
      for (uVar17 = 0;
          uVar17 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0x90); uVar17 = uVar17 + 1) {
        if (0.15 <= (double)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar17].prob) {
          pOVar29 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar17;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17].prob,(double)(pOVar29->rect).x,
                  (double)(pOVar29->rect).y,(double)(pOVar29->rect).width,
                  SUB84((double)(pOVar29->rect).height,0),(ulong)(uint)pOVar29->label);
          local_308.sz.width = 0;
          local_308.sz.height = 0;
          local_308.flags = 0x3010000;
          local_358.refcount._0_4_ = (int)ROUND((pOVar29->rect).width);
          local_358.refcount._4_4_ = (int)ROUND((pOVar29->rect).height);
          lVar16 = (long)(iVar13 % 0x51) * 3;
          local_358.data =
               (void *)CONCAT44((int)ROUND((pOVar29->rect).y),(int)ROUND((pOVar29->rect).x));
          bVar7 = draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)::
                  colors[lVar16 + 2];
          local_308.obj = (vector<float,_std::allocator<float>_> *)&picked;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
          pfVar34 = (pointer)(double)(*(ushort *)
                                       (draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)
                                        ::colors + lVar16) & 0xff);
          pfVar36 = (pointer)(double)(byte)(*(ushort *)
                                             (draw_objects(cv::Mat_const&,std::vector<Object,std::allocator<Object>>const&)
                                              ::colors + lVar16) >> 8);
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = pfVar36;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = pfVar34;
          local_230[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)(double)bVar7;
          cv::rectangle(&local_308,&local_358,&areas,1,8,0);
          sprintf((char *)&areas,"%s %.1f%%",(double)(pOVar29->prob * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)pOVar29->label * 4));
          _baseLine = (float *)((ulong)_baseLine & 0xffffffff00000000);
          std::__cxx11::string::string((string *)&local_308,(char *)&areas,(allocator *)&local_518);
          cv::getTextSize((string *)&label_size,(int)&local_308,0.5,0,(int *)0x1);
          std::__cxx11::string::~string((string *)&local_308);
          iVar15 = (int)(pOVar29->rect).x;
          iVar14 = (int)(((pOVar29->rect).y - (float)label_size.height) - (float)baseLine);
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          iVar28 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_ - label_size.width;
          if (label_size.width + iVar15 <=
              picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish._4_4_) {
            iVar28 = iVar15;
          }
          local_518.elemsize = 0;
          local_518.data._0_4_ = 0x3010000;
          local_3a8.refcount._4_4_ = baseLine + label_size.height;
          local_3a8.data = (void *)CONCAT44(iVar14,iVar28);
          local_3a8.refcount._0_4_ = label_size.width;
          local_518.refcount = (int *)&picked;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_308);
          local_308.flags = 0;
          local_308._4_4_ = 0x406fe000;
          local_308.obj = (vector<float,_std::allocator<float>_> *)0x406fe00000000000;
          local_308.sz.width = 0;
          local_308.sz.height = 0x406fe000;
          uStack_2f0 = 0;
          cv::rectangle(&local_518,&local_3a8,&local_308,0xffffffffffffffff,8,0);
          local_518.elemsize = 0;
          local_518.data = (void *)CONCAT44(local_518.data._4_4_,0x3010000);
          local_518.refcount = (int *)&picked;
          std::__cxx11::string::string
                    ((string *)&local_308,(char *)&areas,(allocator *)&class_candidates);
          local_3f8.data = (void *)CONCAT44(iVar14 + label_size.height,iVar28);
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolact);
          yolact.opt.blob_allocator = (Allocator *)0x0;
          yolact.opt.workspace_allocator = (Allocator *)0x0;
          yolact._vptr_Net = (_func_int **)0x0;
          yolact.opt.lightmode = false;
          yolact.opt.use_shader_pack8 = false;
          yolact.opt.use_subgroup_ops = false;
          yolact.opt.use_reserved_0 = false;
          yolact.opt.num_threads = 0;
          cv::putText(0x3fe0000000000000,&local_518,&local_308,&local_3f8,0,&yolact,1,8,0);
          iVar13 = iVar13 + 1;
          std::__cxx11::string::~string((string *)&local_308);
          for (lVar16 = 0;
              lVar16 < (int)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; lVar16 = lVar16 + 1) {
            lVar31 = **(long **)&pOVar29->field_0x78;
            lVar9 = *(long *)&pOVar29->field_0x40;
            pbVar20 = (byte *)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage +
                              *local_410 * lVar16 + 2);
            for (lVar24 = 0;
                lVar24 < picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_; lVar24 = lVar24 + 1) {
              if (*(char *)(lVar31 * lVar16 + lVar9 + lVar24) == -1) {
                iVar14 = (int)ROUND((double)pbVar20[-2] * 0.5 + (double)pfVar34 * 0.5);
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
                if (0xfe < iVar14) {
                  iVar14 = 0xff;
                }
                pbVar20[-2] = (byte)iVar14;
                iVar14 = (int)ROUND((double)pbVar20[-1] * 0.5 + (double)pfVar36 * 0.5);
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
                if (0xfe < iVar14) {
                  iVar14 = 0xff;
                }
                pbVar20[-1] = (byte)iVar14;
                iVar14 = (int)ROUND((double)*pbVar20 * 0.5 + (double)bVar7 * 0.5);
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
                if (0xfe < iVar14) {
                  iVar14 = 0xff;
                }
                *pbVar20 = (byte)iVar14;
              }
              pbVar20 = pbVar20 + 3;
            }
          }
        }
      }
      std::__cxx11::string::string((string *)&areas,"result.png",(allocator *)&label_size);
      local_308.sz.width = 0;
      local_308.sz.height = 0;
      local_308.flags = 0x1010000;
      local_518.data = (void *)0x0;
      local_518.refcount = (int *)0x0;
      local_518.elemsize = 0;
      local_308.obj = (vector<float,_std::allocator<float>_> *)&picked;
      cv::imwrite((string *)&areas,&local_308,(vector *)&local_518);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_518);
      std::__cxx11::string::~string((string *)&areas);
      std::__cxx11::string::string((string *)&areas,"image",(allocator *)&local_518);
      local_308.sz.width = 0;
      local_308.sz.height = 0;
      local_308.flags = 0x1010000;
      local_308.obj = (vector<float,_std::allocator<float>_> *)&picked;
      cv::imshow((string *)&areas,&local_308);
      std::__cxx11::string::~string((string *)&areas);
      iVar13 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&picked);
      std::vector<Object,_std::allocator<Object>_>::~vector(&objects);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar8);
      iVar13 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolact(m, objects);

    draw_objects(m, objects);

    return 0;
}